

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

_Bool tcg_out_dupm_vec(TCGContext_conflict9 *s,TCGType_conflict type,uint vece,TCGReg r,TCGReg base,
                      intptr_t offset)

{
  tcg_insn_unit *ptVar1;
  undefined1 extraout_AL;
  _Bool _Var2;
  uint vece_00;
  int opc;
  
  if (have_avx2_tricore) {
    opc = (uint)(type == TCG_TYPE_V256) * 0x80000 + avx2_dup_insn[vece];
    goto LAB_00b2751a;
  }
  switch(vece) {
  case 0:
    tcg_out_vex_modrm_offset(s,0x10420,r,r,base,offset);
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = '\0';
    vece_00 = 0;
    break;
  case 1:
    tcg_out_vex_modrm_offset(s,0x5c4,r,r,base,offset);
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = '\0';
    vece_00 = 1;
    break;
  case 2:
    opc = 0x618;
    goto LAB_00b2751a;
  case 3:
    opc = 0x40112;
LAB_00b2751a:
    tcg_out_vex_modrm_offset(s,opc,r,0,base,offset);
    return (_Bool)extraout_AL;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x3b2,(char *)0x0);
  }
  _Var2 = tcg_out_dup_vec(s,type,vece_00,r,r);
  return _Var2;
}

Assistant:

static bool tcg_out_dupm_vec(TCGContext *s, TCGType type, unsigned vece,
                             TCGReg r, TCGReg base, intptr_t offset)
{
    if (have_avx2) {
        int vex_l = (type == TCG_TYPE_V256 ? P_VEXL : 0);
        tcg_out_vex_modrm_offset(s, avx2_dup_insn[vece] + vex_l,
                                 r, 0, base, offset);
    } else {
        switch (vece) {
        case MO_64:
            tcg_out_vex_modrm_offset(s, OPC_MOVDDUP, r, 0, base, offset);
            break;
        case MO_32:
            tcg_out_vex_modrm_offset(s, OPC_VBROADCASTSS, r, 0, base, offset);
            break;
        case MO_16:
            tcg_out_vex_modrm_offset(s, OPC_VPINSRW, r, r, base, offset);
            tcg_out8(s, 0); /* imm8 */
            tcg_out_dup_vec(s, type, vece, r, r);
            break;
        case MO_8:
            tcg_out_vex_modrm_offset(s, OPC_VPINSRB, r, r, base, offset);
            tcg_out8(s, 0); /* imm8 */
            tcg_out_dup_vec(s, type, vece, r, r);
            break;
        default:
            g_assert_not_reached();
        }
    }
    return true;
}